

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase676::run(TestCase676 *this)

{
  Reader reader;
  undefined8 *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  int chainedCallCount;
  int callCount;
  char *local_340;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  DebugComparison<int,_int_&> _kjCondition_3;
  WaitScope waitScope;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Client client;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  Maybe<capnp::MessageSize> local_f0;
  Maybe<capnp::MessageSize> local_d8;
  Maybe<capnp::MessageSize> local_c0;
  EventLoop loop;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  callCount = 0;
  chainedCallCount = 0;
  response2.super_Reader._reader.capTable = (CapTableReader *)operator_new(0x28);
  response2.super_Reader._reader.capTable[1]._vptr_CapTableReader = (_func_int **)0x0;
  response2.super_Reader._reader.capTable[2]._vptr_CapTableReader =
       (_func_int **)(schemas::s_a5a404caa61d4cd0 + 0x48);
  *(undefined1 *)&response2.super_Reader._reader.capTable[3]._vptr_CapTableReader = 0;
  (response2.super_Reader._reader.capTable)->_vptr_CapTableReader =
       (_func_int **)&PTR_dispatchCall_0064b178;
  response2.super_Reader._reader.capTable[4]._vptr_CapTableReader = (_func_int **)&callCount;
  __n = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl>::instance;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl>::instance;
  response2.super_Reader._reader.segment =
       (SegmentReader *)
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl>::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  Capability::Client::makeLocalClient
            ((Client *)&response,(Own<capnp::Capability::Server,_std::nullptr_t> *)&response2);
  kj::Own<capnp::Capability::Server,_std::nullptr_t>::dispose
            ((Own<capnp::Capability::Server,_std::nullptr_t> *)&response2);
  response.super_Reader._reader.data = schemas::s_a5a404caa61d4cd0 + 0x48;
  Capability::Client::castAs<capnproto_test::capnp::test::TestPipeline>(&client,(Client *)&response)
  ;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&response);
  kj::Own<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestPipelineDynamicImpl,_std::nullptr_t> *)
             &request);
  local_c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest(&request,&client,&local_c0);
  *(undefined4 *)request.super_Builder._builder.data = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&response2,&chainedCallCount);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&response,(Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)&response2);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setInCap
            (&request.super_Builder,(Client *)&response);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&response.super_Reader._reader.capTable);
  kj::Own<capnp::_::TestInterfaceImpl,_std::nullptr_t>::dispose
            ((Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)&response2);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)&promise,(int)&request,__buf,(size_t)__n,in_R8D);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            ((Pipeline *)&response,&promise.super_Pipeline);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&response2,(Pipeline *)&response);
  local_d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&pipelineRequest,(Client *)&response2,&local_d8);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&response2.super_Reader._reader.capTable);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response);
  *(undefined4 *)pipelineRequest.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&pipelinePromise,(int)&pipelineRequest,__buf_00,(size_t)__n,in_R8D);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            ((Pipeline *)&response,&promise.super_Pipeline);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&pipelinePromise2,(Pipeline *)&response);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            ((Client *)&response2,
             (Client *)
             ((long)&pipelinePromise2.
                     super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
                     super_PromiseBase.node.ptr +
             *(long *)((long)pipelinePromise2.
                             super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>
                             .super_PromiseBase.node.ptr + -0x18)));
  local_f0.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&pipelineRequest2,(Client *)&response2,&local_f0);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&response2.super_Reader._reader.capTable);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&pipelinePromise2.super_Pipeline);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)&pipelinePromise2,(int)&pipelineRequest2,__buf_01,(size_t)__n,in_R8D);
  response.super_Reader._reader.dataSize = 0;
  response.super_Reader._reader.pointerCount = 0;
  response.super_Reader._reader._38_2_ = 0;
  response.super_Reader._reader.nestingLimit = 0;
  response.super_Reader._reader._44_4_ = 0;
  response.super_Reader._reader.data = (void *)0x0;
  response.super_Reader._reader.pointers = (WirePointer *)0x0;
  response.super_Reader._reader.segment = (SegmentReader *)0x0;
  response.super_Reader._reader.capTable = (CapTableReader *)0x0;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            (&promise,(RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
                      &response);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)&response);
  response.super_Reader._reader.segment =
       (SegmentReader *)((ulong)response.super_Reader._reader.segment & 0xffffffff00000000);
  response.super_Reader._reader.data = anon_var_dwarf_3d166;
  response.super_Reader._reader.pointers = (WirePointer *)&DAT_00000005;
  if (kj::_::Debug::minSeverity < 3 && callCount != 0) {
    response2.super_Reader._reader.segment =
         (SegmentReader *)((ulong)response2.super_Reader._reader.segment & 0xffffffff00000000);
    response.super_Reader._reader.capTable = (CapTableReader *)&callCount;
    response.super_Reader._reader.dataSize._0_1_ = callCount == 0;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2bd,ERROR,
               "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",
               (DebugComparison<int,_int_&> *)&response,(int *)&response2,&callCount);
  }
  response.super_Reader._reader.segment =
       (SegmentReader *)((ulong)response.super_Reader._reader.segment & 0xffffffff00000000);
  response.super_Reader._reader.data = anon_var_dwarf_3d166;
  response.super_Reader._reader.pointers = (WirePointer *)&DAT_00000005;
  response.super_Reader._reader.dataSize._0_1_ = chainedCallCount == 0;
  response.super_Reader._reader.capTable = (CapTableReader *)&chainedCallCount;
  if ((chainedCallCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    response2.super_Reader._reader.segment =
         (SegmentReader *)((ulong)response2.super_Reader._reader.segment & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2be,ERROR,
               "\"failed: expected \" \"(0) == (chainedCallCount)\", _kjCondition, 0, chainedCallCount"
               ,(char (*) [43])"failed: expected (0) == (chainedCallCount)",
               (DebugComparison<int,_int_&> *)&response,(int *)&response2,&chainedCallCount);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response,&pipelinePromise);
  local_340 = "bar";
  _kjCondition_3._0_16_ =
       capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX(&response.super_Reader);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&response2,
             (DebugExpression<char_const(&)[4]> *)&local_340,(Reader *)&_kjCondition_3);
  if (((char)response2.super_Reader._reader.nestingLimit == '\0') && (kj::_::Debug::minSeverity < 3)
     ) {
    _kjCondition_3._0_16_ =
         capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                   (&response.super_Reader);
    kj::_::Debug::
    log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2c1,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", _kjCondition, \"bar\", response.getX()"
               ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&response2,
               (char (*) [4])0x45cd55,(Reader *)&_kjCondition_3);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&response2,
             &pipelinePromise2);
  reader._reader._41_7_ = response2.super_Reader._reader._41_7_;
  reader._reader.nestingLimit._0_1_ = (char)response2.super_Reader._reader.nestingLimit;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  checkTestMessage(reader);
  _kjCondition_3.result = callCount == 3;
  _kjCondition_3.left = 3;
  _kjCondition_3.right = &callCount;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_3.result) {
    local_340 = (char *)CONCAT44(local_340._4_4_,3);
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2c6,ERROR,
               "\"failed: expected \" \"(3) == (callCount)\", _kjCondition, 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",&_kjCondition_3,
               (int *)&local_340,&callCount);
  }
  _kjCondition_3.result = chainedCallCount == 1;
  _kjCondition_3.left = 1;
  _kjCondition_3.right = &chainedCallCount;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  if ((!_kjCondition_3.result) && (kj::_::Debug::minSeverity < 3)) {
    local_340 = (char *)CONCAT44(local_340._4_4_,1);
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2c7,ERROR,
               "\"failed: expected \" \"(1) == (chainedCallCount)\", _kjCondition, 1, chainedCallCount"
               ,(char (*) [43])"failed: expected (1) == (chainedCallCount)",&_kjCondition_3,
               (int *)&local_340,&chainedCallCount);
  }
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&response2.hook);
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&response.hook);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise(&pipelinePromise2);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&pipelineRequest2.hook);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            (&pipelinePromise);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&pipelineRequest.hook);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise(&promise);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&request.hook);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&client.field_0x8);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, DynamicServerPipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  test::TestPipeline::Client client =
      DynamicCapability::Client(kj::heap<TestPipelineDynamicImpl>(callCount))
          .castAs<test::TestPipeline>();

  auto request = client.getCapRequest();
  request.setN(234);
  request.setInCap(test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
  pipelineRequest.setI(321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = promise.getOutBox().getCap().castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.getX());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}